

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  xpath_lexer_string *pxVar1;
  char cVar2;
  lexeme_t lVar3;
  nodetest_t axis;
  xpath_ast_node *pxVar4;
  xpath_parse_result *pxVar5;
  char_t *pcVar6;
  ulong uVar7;
  xpath_ast_node *pxVar8;
  xpath_ast_node **ppxVar9;
  char *pcVar10;
  ast_type_t type;
  char_t *in_R9;
  xpath_ast_node **ppxVar11;
  bool bVar12;
  xpath_ast_node *pxStack_60;
  xpath_allocator *local_58;
  char_t *pcStack_50;
  char_t *local_40;
  xpath_ast_node *local_38;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    pxVar5 = this->_result;
    pcVar10 = "Step has to be applied to node set";
    goto LAB_0012c552;
  }
  this_00 = &this->_lexer;
  lVar3 = (this->_lexer)._cur_lexeme;
  type = (ast_type_t)set;
  if (lVar3 == lex_double_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxStack_60 = (xpath_ast_node *)0x9;
LAB_0012c321:
      pxVar4 = alloc_node(this,type,pxStack_60,axis_attribute,nodetest_none,in_R9);
      return pxVar4;
    }
  }
  else {
    if (lVar3 != lex_dot) {
      bVar12 = lVar3 != lex_axis_attribute;
      if (bVar12) {
        pxStack_60 = (xpath_ast_node *)0x3;
        pcVar10 = &set->_type;
      }
      else {
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        pxStack_60 = (xpath_ast_node *)0x2;
        pcVar10 = &set->_type;
      }
      if (lVar3 == lex_multiply) {
LAB_0012c632:
        pcStack_50 = (char_t *)0x0;
        local_58 = (xpath_allocator *)0x0;
        xpath_lexer::next(this_00);
        axis = nodetest_all;
      }
      else {
        if (lVar3 != lex_string) {
LAB_0012c547:
          pxVar5 = this->_result;
          pcVar10 = "Unrecognized node test";
          goto LAB_0012c552;
        }
        pxVar1 = &(this->_lexer)._cur_lexeme_contents;
        local_58 = (xpath_allocator *)(this->_lexer)._cur_lexeme_contents.begin;
        pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
        xpath_lexer::next(this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        if (lVar3 == lex_double_colon) {
          if (!bVar12) {
            pxVar5 = this->_result;
            pcVar10 = "Two axis specifiers in one step";
            goto LAB_0012c552;
          }
          cVar2 = *(char *)&local_58->_root;
          switch(cVar2) {
          case 'a':
            pcVar10 = "ancestor";
            bVar12 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffa8,"ancestor");
            pxStack_60 = (xpath_ast_node *)0x0;
            if (!bVar12) {
              pcVar10 = "ancestor-or-self";
              bVar12 = xpath_lexer_string::operator==
                                 ((xpath_lexer_string *)&stack0xffffffffffffffa8,"ancestor-or-self")
              ;
              if (bVar12) {
                pxStack_60 = (xpath_ast_node *)0x1;
              }
              else {
                pcVar10 = "attribute";
                bVar12 = xpath_lexer_string::operator==
                                   ((xpath_lexer_string *)&stack0xffffffffffffffa8,"attribute");
                if (!bVar12) goto switchD_0012c35e_caseD_62;
                pxStack_60 = (xpath_ast_node *)0x2;
              }
            }
            break;
          case 'b':
          case 'e':
switchD_0012c35e_caseD_62:
            pxVar5 = this->_result;
            pcVar10 = "Unknown axis";
            goto LAB_0012c552;
          case 'c':
            pcVar10 = "child";
            bVar12 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffa8,"child");
            if (!bVar12) goto switchD_0012c35e_caseD_62;
            pxStack_60 = (xpath_ast_node *)0x3;
            break;
          case 'd':
            pcVar10 = "descendant";
            bVar12 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffa8,"descendant");
            if (bVar12) {
              pxStack_60 = (xpath_ast_node *)0x4;
            }
            else {
              pcVar10 = "descendant-or-self";
              bVar12 = xpath_lexer_string::operator==
                                 ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                  "descendant-or-self");
              if (!bVar12) goto switchD_0012c35e_caseD_62;
              pxStack_60 = (xpath_ast_node *)0x5;
            }
            break;
          case 'f':
            pcVar10 = "following";
            bVar12 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffa8,"following");
            if (bVar12) {
              pxStack_60 = (xpath_ast_node *)0x6;
            }
            else {
              pcVar10 = "following-sibling";
              bVar12 = xpath_lexer_string::operator==
                                 ((xpath_lexer_string *)&stack0xffffffffffffffa8,"following-sibling"
                                 );
              if (!bVar12) goto switchD_0012c35e_caseD_62;
              pxStack_60 = (xpath_ast_node *)0x7;
            }
            break;
          default:
            if (cVar2 == 'n') {
              pcVar10 = "namespace";
              bVar12 = xpath_lexer_string::operator==
                                 ((xpath_lexer_string *)&stack0xffffffffffffffa8,"namespace");
              if (!bVar12) goto switchD_0012c35e_caseD_62;
              pxStack_60 = (xpath_ast_node *)0x8;
            }
            else {
              if (cVar2 != 'p') {
                if (cVar2 == 's') {
                  pcVar10 = "self";
                  bVar12 = xpath_lexer_string::operator==
                                     ((xpath_lexer_string *)&stack0xffffffffffffffa8,"self");
                  if (bVar12) {
                    pxStack_60 = (xpath_ast_node *)0xc;
                    break;
                  }
                }
                goto switchD_0012c35e_caseD_62;
              }
              pcVar10 = "parent";
              bVar12 = xpath_lexer_string::operator==
                                 ((xpath_lexer_string *)&stack0xffffffffffffffa8,"parent");
              if (bVar12) {
                pxStack_60 = (xpath_ast_node *)0x9;
              }
              else {
                pcVar10 = "preceding";
                bVar12 = xpath_lexer_string::operator==
                                   ((xpath_lexer_string *)&stack0xffffffffffffffa8,"preceding");
                if (bVar12) {
                  pxStack_60 = (xpath_ast_node *)0xa;
                }
                else {
                  pcVar10 = "preceding-sibling";
                  bVar12 = xpath_lexer_string::operator==
                                     ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                      "preceding-sibling");
                  if (!bVar12) goto switchD_0012c35e_caseD_62;
                  pxStack_60 = (xpath_ast_node *)0xb;
                }
              }
            }
          }
          xpath_lexer::next(this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_multiply) goto LAB_0012c632;
          if (lVar3 != lex_string) goto LAB_0012c547;
          local_58 = (xpath_allocator *)pxVar1->begin;
          pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
          xpath_lexer::next(this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
        }
        if (lVar3 == lex_open_brace) {
          xpath_lexer::next(this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_close_brace) {
            xpath_lexer::next(this_00);
            axis = parse_node_test_type
                             ((xpath_parser *)&stack0xffffffffffffffa8,(xpath_lexer_string *)pcVar10
                             );
            if (axis == nodetest_none) {
              pxVar5 = this->_result;
              pcVar10 = "Unrecognized node type";
              goto LAB_0012c552;
            }
            local_58 = (xpath_allocator *)0x0;
            pcStack_50 = (char_t *)0x0;
          }
          else {
            bVar12 = xpath_lexer_string::operator==
                               ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                "processing-instruction");
            if (!bVar12) {
              pxVar5 = this->_result;
              pcVar10 = "Unmatched brace near node type test";
              goto LAB_0012c552;
            }
            if (lVar3 != lex_quoted_string) {
              pxVar5 = this->_result;
              pcVar10 = "Only literals are allowed as arguments to processing-instruction()";
              goto LAB_0012c552;
            }
            local_58 = (xpath_allocator *)pxVar1->begin;
            pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
            xpath_lexer::next(this_00);
            if ((this->_lexer)._cur_lexeme != lex_close_brace) {
              pxVar5 = this->_result;
              pcVar10 = "Unmatched brace near processing-instruction()";
              goto LAB_0012c552;
            }
            axis = nodetest_pi;
            xpath_lexer::next(this_00);
          }
        }
        else {
          axis = nodetest_name;
          if (((2 < (long)pcStack_50 - (long)local_58) && (pcStack_50[-2] == ':')) &&
             (pcStack_50[-1] == '*')) {
            axis = nodetest_all_in_namespace;
            pcStack_50 = pcStack_50 + -1;
          }
        }
      }
      pcVar6 = alloc_string(this,(xpath_lexer_string *)&stack0xffffffffffffffa8);
      if (pcVar6 == (char_t *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      local_38 = alloc_node(this,type,pxStack_60,axis,(nodetest_t)pcVar6,in_R9);
      if (local_38 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      local_40 = (char_t *)this->_depth;
      ppxVar11 = &local_38->_right;
      pxVar4 = (xpath_ast_node *)0x0;
      while( true ) {
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          this->_depth = (size_t)local_40;
          return local_38;
        }
        xpath_lexer::next(this_00);
        uVar7 = this->_depth + 1;
        this->_depth = uVar7;
        if (0x400 < uVar7) break;
        pxVar8 = parse_expression(this,0);
        if (pxVar8 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar8 = alloc_node(this,ast_predicate,(xpath_ast_node *)0x0,pxVar8,(predicate_t)pcVar6);
        if (pxVar8 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
          pxVar5 = this->_result;
          pcVar10 = "Expected \']\' to match an opening \'[\'";
          goto LAB_0012c552;
        }
        xpath_lexer::next(this_00);
        ppxVar9 = &pxVar4->_next;
        if (pxVar4 == (xpath_ast_node *)0x0) {
          ppxVar9 = ppxVar11;
        }
        *ppxVar9 = pxVar8;
        pxVar4 = pxVar8;
      }
      pxVar5 = this->_result;
      pcVar10 = "Exceeded maximum allowed query depth";
      goto LAB_0012c552;
    }
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxStack_60 = (xpath_ast_node *)0xc;
      goto LAB_0012c321;
    }
  }
  pxVar5 = this->_result;
  pcVar10 = "Predicates are not allowed after an abbreviated step";
LAB_0012c552:
  pxVar5->error = pcVar10;
  pxVar5->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, NULL);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, NULL);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return NULL;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return NULL;

			size_t old_depth = _depth;

			xpath_ast_node* last = NULL;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return NULL;

				xpath_ast_node* pred = alloc_node(ast_predicate, NULL, expr, predicate_default);
				if (!pred) return NULL;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			_depth = old_depth;

			return n;
		}